

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O0

LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> * __thiscall
limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::operator=
          (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this,
          LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *vec)

{
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *__src;
  size_t sVar1;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *ppVar2;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *vec_local;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this_local;
  
  clear(this);
  sVar1 = size(vec);
  this->size_ = sVar1;
  sVar1 = capacity(vec);
  this->capacity_ = sVar1;
  if (vec == (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)vec->ptr_) {
    memcpy(this,vec,this->size_ << 4);
    this->ptr_ = this->buffer_;
  }
  else {
    sVar1 = capacity(vec);
    ppVar2 = (pair<unsigned_long,_const_cppjieba::DictUnit_*> *)malloc(sVar1 << 4);
    this->ptr_ = ppVar2;
    if (this->ptr_ == (pair<unsigned_long,_const_cppjieba::DictUnit_*> *)0x0) {
      __assert_fail("ptr_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/limonp/LocalVector.hpp"
                    ,0x3e,
                    "LocalVector<T> &limonp::LocalVector<std::pair<unsigned long, const cppjieba::DictUnit *>>::operator=(const LocalVector<T> &) [T = std::pair<unsigned long, const cppjieba::DictUnit *>]"
                   );
    }
    ppVar2 = this->ptr_;
    __src = vec->ptr_;
    sVar1 = size(vec);
    memcpy(ppVar2,__src,sVar1 << 4);
  }
  return this;
}

Assistant:

LocalVector<T>& operator = (const LocalVector<T>& vec) {
    clear();
    size_ = vec.size();
    capacity_ = vec.capacity();
    if(vec.buffer_ == vec.ptr_) {
      memcpy(buffer_, vec.buffer_, sizeof(T) * size_);
      ptr_ = buffer_;
    } else {
      ptr_ = (T*) malloc(vec.capacity() * sizeof(T));
      assert(ptr_);
      memcpy(ptr_, vec.ptr_, vec.size() * sizeof(T));
    }
    return *this;
  }